

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

void __thiscall
osc::ReceivedMessageArgument::AsBlobUnchecked
          (ReceivedMessageArgument *this,void **data,osc_bundle_element_size_t *size)

{
  bool bVar1;
  uint32 x;
  MalformedMessageException *this_00;
  osc_bundle_element_size_t sizeResult;
  osc_bundle_element_size_t *size_local;
  void **data_local;
  ReceivedMessageArgument *this_local;
  
  x = ToUInt32(this->argumentPtr_);
  bVar1 = IsValidElementSizeValue(x);
  if (!bVar1) {
    this_00 = (MalformedMessageException *)__cxa_allocate_exception(0x10);
    MalformedMessageException::MalformedMessageException(this_00,"invalid blob size");
    __cxa_throw(this_00,&MalformedMessageException::typeinfo,
                MalformedMessageException::~MalformedMessageException);
  }
  *size = x;
  *data = this->argumentPtr_ + 4;
  return;
}

Assistant:

void ReceivedMessageArgument::AsBlobUnchecked( const void*& data, osc_bundle_element_size_t& size ) const
{
    // read blob size as an unsigned int then validate
    osc_bundle_element_size_t sizeResult = (osc_bundle_element_size_t)ToUInt32( argumentPtr_ );
    if( !IsValidElementSizeValue(sizeResult) )
        throw MalformedMessageException("invalid blob size");

    size = sizeResult;
	data = (void*)(argumentPtr_+ osc::OSC_SIZEOF_INT32);
}